

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O0

int __thiscall StringBTree::equalKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  uint64_t uVar1;
  uint *puVar2;
  uint8_t *in_RDX;
  StringKey *in_RSI;
  uint i;
  uint minLength;
  char *otherValue;
  uint32_t otherLength;
  char *curValue;
  uint curLength;
  uint local_4c;
  uint local_48 [2];
  uint8_t *local_40;
  uint local_34;
  char *local_30;
  uint local_24;
  uint8_t *local_20;
  StringKey *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_24 = StringKey::length(in_RSI);
  local_30 = StringKey::value(local_18);
  uVar1 = decodeBitsAndAdvance(&local_20);
  local_34 = (uint)uVar1;
  local_40 = local_20;
  local_48[0] = StringKey::length(local_18);
  puVar2 = std::min<unsigned_int>(local_48,&local_34);
  local_4c = 0;
  while( true ) {
    if (*puVar2 <= local_4c) {
      if (local_24 < local_34) {
        local_4 = -1;
      }
      else if (local_34 < local_24) {
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
      return local_4;
    }
    if (local_30[local_4c] < (char)local_40[local_4c]) break;
    if ((char)local_40[local_4c] < local_30[local_4c]) {
      return 1;
    }
    local_4c = local_4c + 1;
  }
  return -1;
}

Assistant:

int equalKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		const auto curLength = key.length();
		const auto curValue = key.value();
		const auto otherLength = static_cast<uint32_t>(decodeBitsAndAdvance(data));
		const auto otherValue = reinterpret_cast<const char*>(data);
		const auto minLength = std::min(key.length(), otherLength);
		
		for (auto i = 0u; i < minLength; ++i) {
			if (curValue[i] < otherValue[i])
				return -1;
			else if (curValue[i] > otherValue[i])
				return 1;
		}
		
		if (curLength < otherLength)
			return -1;
		else if (curLength > otherLength)
			return 1;

		return 0;
	}